

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int write_to_file(WFile *f,void *buffer,int length)

{
  bool bVar1;
  uint uVar2;
  ssize_t sVar3;
  int iVar4;
  uint uVar5;
  
  if (length < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      sVar3 = write(f->fd,buffer,(ulong)(uint)length);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 0) {
        return uVar2;
      }
      if (uVar2 == 0) {
        return iVar4;
      }
      buffer = (void *)((long)buffer + (ulong)(uVar2 & 0x7fffffff));
      iVar4 = iVar4 + uVar2;
      uVar5 = length - uVar2;
      bVar1 = (int)uVar2 <= length;
      length = uVar5;
    } while (uVar5 != 0 && bVar1);
  }
  return iVar4;
}

Assistant:

int write_to_file(WFile *f, void *buffer, int length)
{
    char *p = (char *)buffer;
    int so_far = 0;

    /* Keep trying until we've really written as much as we can. */
    while (length > 0) {
        int ret = write(f->fd, p, length);

        if (ret < 0)
            return ret;

        if (ret == 0)
            break;

        p += ret;
        length -= ret;
        so_far += ret;
    }

    return so_far;
}